

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

void __thiscall SQStringTable::Resize(SQStringTable *this,SQInteger size)

{
  SQString **p;
  SQUnsignedInteger SVar1;
  SQUnsignedInteger SVar2;
  SQString *pSVar3;
  SQString *pSVar4;
  SQString **ppSVar5;
  SQUnsignedInteger SVar6;
  ulong uVar7;
  
  p = this->_strings;
  SVar1 = this->_numofslots;
  this->_numofslots = size;
  ppSVar5 = (SQString **)sq_vm_malloc(size * 8);
  this->_strings = ppSVar5;
  memset(ppSVar5,0,this->_numofslots << 3);
  if (0 < (long)SVar1) {
    SVar2 = this->_numofslots;
    SVar6 = 0;
    do {
      pSVar4 = p[SVar6];
      while (pSVar4 != (SQString *)0x0) {
        pSVar3 = pSVar4->_next;
        uVar7 = pSVar4->_hash & SVar2 - 1;
        ppSVar5 = this->_strings;
        pSVar4->_next = ppSVar5[uVar7];
        ppSVar5[uVar7] = pSVar4;
        pSVar4 = pSVar3;
      }
      SVar6 = SVar6 + 1;
    } while (SVar6 != SVar1);
  }
  sq_vm_free(p,SVar1 << 3);
  return;
}

Assistant:

void SQStringTable::Resize(SQInteger size)
{
    SQInteger oldsize=_numofslots;
    SQString **oldtable=_strings;
    AllocNodes(size);
    for (SQInteger i=0; i<oldsize; i++){
        SQString *p = oldtable[i];
        while(p){
            SQString *next = p->_next;
            SQHash h = p->_hash&(_numofslots-1);
            p->_next = _strings[h];
            _strings[h] = p;
            p = next;
        }
    }
    SQ_FREE(oldtable,oldsize*sizeof(SQString*));
}